

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool operator==(BigNum *a,BigNum *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  BigNum local_98;
  BigNum local_78;
  BigNum local_58;
  BigNum local_38;
  
  BigNum::BigNum(&local_78,a);
  BigNum::BigNum(&local_98,b);
  if (local_78.sign == local_98.sign) {
    uVar4 = (ulong)(uint)local_78.length;
    bVar3 = true;
    if (local_98.length < local_78.length) goto LAB_001024eb;
    if (local_98.length <= local_78.length) {
      do {
        if ((int)uVar4 < 1) break;
        lVar1 = uVar4 - 1;
        lVar2 = uVar4 - 1;
        if (local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2] <
            local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar1]) goto LAB_001024eb;
        uVar4 = uVar4 - 1;
      } while (local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2] <=
               local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar1]);
    }
  }
  else {
    bVar3 = true;
    if (local_78.sign != false) goto LAB_001024eb;
  }
  BigNum::BigNum(&local_38,a);
  BigNum::BigNum(&local_58,b);
  bVar3 = operator<(&local_38,&local_58);
  if (local_58.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001024eb:
  if (local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool operator ==(BigNum a, BigNum b){
    return !(a > b || a < b);
}